

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O3

void mean_double_suite::test_linear_increase(void)

{
  close_to<double> predicate;
  close_to<double> predicate_00;
  close_to<double> predicate_01;
  close_to<double> predicate_02;
  close_to<double> predicate_03;
  close_to<double> predicate_04;
  close_to<double> predicate_05;
  close_to<double> predicate_06;
  close_to<double> predicate_07;
  close_to<double> predicate_08;
  double *in_stack_ffffffffffffffb8;
  double local_40;
  char local_38 [8];
  
  local_38[0] = '\0';
  local_38[1] = '\0';
  local_38[2] = '\0';
  local_38[3] = '\0';
  local_38[4] = '\0';
  local_38[5] = '\0';
  local_38[6] = -0x10;
  local_38[7] = '?';
  local_40 = 1.0;
  predicate.absolute = 2.2250738585072014e-308;
  predicate.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","1.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x7d,0x10e29a,local_38,&local_40,in_stack_ffffffffffffffb8,predicate);
  local_38[0] = -0x77;
  local_38[1] = -0x78;
  local_38[2] = -0x78;
  local_38[3] = -0x78;
  local_38[4] = -0x78;
  local_38[5] = -0x78;
  local_38[6] = -8;
  local_38[7] = '?';
  local_40 = 1.53333;
  predicate_00.absolute = 2.2250738585072014e-308;
  predicate_00.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","1.53333","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x7f,0x10e29a,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_00);
  local_38[0] = -0x69;
  local_38[1] = '<';
  local_38[2] = '\x18';
  local_38[3] = 'p';
  local_38[4] = -0x3a;
  local_38[5] = -0x4b;
  local_38[6] = '\0';
  local_38[7] = '@';
  local_40 = 2.08876;
  predicate_01.absolute = 2.2250738585072014e-308;
  predicate_01.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","2.08876","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x81,0x10e29a,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_01);
  local_38[0] = '\0';
  local_38[1] = 'B';
  local_38[2] = -0x2b;
  local_38[3] = '\x04';
  local_38[4] = ' ';
  local_38[5] = 'T';
  local_38[6] = '\x05';
  local_38[7] = '@';
  local_40 = 2.66608;
  predicate_02.absolute = 2.2250738585072014e-308;
  predicate_02.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","2.66608","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x83,0x10e29a,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_02);
  local_38[0] = -0x5b;
  local_38[1] = 'a';
  local_38[2] = -8;
  local_38[3] = 'R';
  local_38[4] = -0x3d;
  local_38[5] = '\x1e';
  local_38[6] = '\n';
  local_38[7] = '@';
  local_40 = 3.26502;
  predicate_03.absolute = 2.2250738585072014e-308;
  predicate_03.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","3.26502","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x85,0x10e29a,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_03);
  local_38[0] = -0x75;
  local_38[1] = '\"';
  local_38[2] = '\x19';
  local_38[3] = ';';
  local_38[4] = -3;
  local_38[5] = '\x14';
  local_38[6] = '\x0f';
  local_38[7] = '@';
  local_40 = 3.88525;
  predicate_04.absolute = 2.2250738585072014e-308;
  predicate_04.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","3.88525","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x87,0x10e29a,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_04);
  local_38[0] = 'S';
  local_38[1] = -0x59;
  local_38[2] = '#';
  local_38[3] = -0x52;
  local_38[4] = -5;
  local_38[5] = '\x1a';
  local_38[6] = '\x12';
  local_38[7] = '@';
  local_40 = 4.52635;
  predicate_05.absolute = 2.2250738585072014e-308;
  predicate_05.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","4.52635","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x89,0x10e29a,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_05);
  local_38[0] = -0x1f;
  local_38[1] = '\x1f';
  local_38[2] = 'W';
  local_38[3] = 'Q';
  local_38[4] = ']';
  local_38[5] = -0x40;
  local_38[6] = '\x14';
  local_38[7] = '@';
  local_40 = 5.18786;
  predicate_06.absolute = 2.2250738585072014e-308;
  predicate_06.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","5.18786","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x8b,0x10e29a,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_06);
  local_38[0] = '\x0e';
  local_38[1] = -0x1e;
  local_38[2] = -0x40;
  local_38[3] = '\x13';
  local_38[4] = '\x19';
  local_38[5] = 'z';
  local_38[6] = '\x17';
  local_38[7] = '@';
  local_40 = 5.86924;
  predicate_07.absolute = 2.2250738585072014e-308;
  predicate_07.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","5.86924","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x8d,0x10e29a,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_07);
  local_38[0] = -0x52;
  local_38[1] = -0x50;
  local_38[2] = -0xc;
  local_38[3] = '(';
  local_38[4] = -0x69;
  local_38[5] = 'G';
  local_38[6] = '\x1a';
  local_38[7] = '@';
  local_40 = 6.56991;
  predicate_08.absolute = 2.2250738585072014e-308;
  predicate_08.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","6.56991","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x8f,0x10e29a,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_08);
  return;
}

Assistant:

void test_linear_increase()
{
    const auto tolerance = detail::close_to<double>(1e-5);
    decay::moment<double> filter(one_over_eight);

    filter.push(1.0);
    TRIAL_TEST_WITH(filter.mean(), 1.0, tolerance);
    filter.push(2.0);
    TRIAL_TEST_WITH(filter.mean(), 1.53333, tolerance);
    filter.push(3.0);
    TRIAL_TEST_WITH(filter.mean(), 2.08876, tolerance);
    filter.push(4.0);
    TRIAL_TEST_WITH(filter.mean(), 2.66608, tolerance);
    filter.push(5.0);
    TRIAL_TEST_WITH(filter.mean(), 3.26502, tolerance);
    filter.push(6.0);
    TRIAL_TEST_WITH(filter.mean(), 3.88525, tolerance);
    filter.push(7.0);
    TRIAL_TEST_WITH(filter.mean(), 4.52635, tolerance);
    filter.push(8.0);
    TRIAL_TEST_WITH(filter.mean(), 5.18786, tolerance);
    filter.push(9.0);
    TRIAL_TEST_WITH(filter.mean(), 5.86924, tolerance);
    filter.push(10.0);
    TRIAL_TEST_WITH(filter.mean(), 6.56991, tolerance);
}